

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

int string_cmp_string(http_string_t string_a,http_string_t string_b)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar2 = 0;
  if (string_a.len == string_b.len) {
    uVar2 = (uint)string_a.len;
    bVar4 = (int)uVar2 < 1;
    if (0 < (int)uVar2) {
      if (*string_a.value == *string_b.value) {
        uVar1 = 1;
        do {
          uVar3 = uVar1;
          if ((uVar2 & 0x7fffffff) == uVar3) break;
          uVar1 = uVar3 + 1;
        } while (string_a.value[uVar3] == string_b.value[uVar3]);
        bVar4 = (uVar2 & 0x7fffffff) <= uVar3;
      }
      else {
        bVar4 = false;
      }
    }
    uVar2 = (uint)bVar4;
  }
  return uVar2;
}

Assistant:

int string_cmp_string(http_string_t string_a, http_string_t string_b) {
    return string_a.len == string_b.len && nh_string_cmp(string_a.value, string_b.value, string_a.len);
}